

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Mask.cpp
# Opt level: O1

istream * amrex::operator>>(istream *is,Mask *m)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  istream *this;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int ncomp;
  IntVect q;
  Box b;
  int local_64;
  int local_60;
  int local_5c;
  IntVect local_58;
  Box local_4c;
  
  std::istream::ignore((long)is,100000);
  local_4c.smallend.vect[0] = 1;
  local_4c.smallend.vect[1] = 1;
  local_4c.smallend.vect[2] = 1;
  local_4c.bigend.vect[0] = 0;
  local_4c.bigend.vect[1] = 0;
  local_4c.bigend.vect[2] = 0;
  local_4c.btype.itype = 0;
  this = operator>>(is,&local_4c);
  std::istream::operator>>((istream *)this,&local_64);
  std::istream::ignore((long)is,100000);
  BaseFab<int>::resize(&m->super_BaseFab<int>,&local_4c,local_64,(Arena *)0x0);
  iVar6 = local_4c.bigend.vect[2];
  local_58.vect[0] = 0;
  local_58.vect[1] = 0;
  local_58.vect[2] = 0;
  iVar4 = local_4c.smallend.vect[0];
  iVar5 = local_4c.smallend.vect[1];
  local_60 = local_4c.bigend.vect[0];
  local_5c = local_4c.bigend.vect[1];
  iVar9 = local_4c.smallend.vect[2];
  while ((iVar9 <= iVar6 &&
         ((iVar6 != iVar9 || ((iVar5 <= local_5c && ((local_5c != iVar5 || (iVar4 <= local_60)))))))
         )) {
    operator>>(is,&local_58);
    if (0 < local_64) {
      lVar10 = 0;
      do {
        iVar1 = (m->super_BaseFab<int>).domain.smallend.vect[0];
        iVar2 = (m->super_BaseFab<int>).domain.smallend.vect[1];
        iVar7 = ((m->super_BaseFab<int>).domain.bigend.vect[0] - iVar1) + 1;
        iVar3 = (m->super_BaseFab<int>).domain.smallend.vect[2];
        iVar8 = ((m->super_BaseFab<int>).domain.bigend.vect[1] - iVar2) + 1;
        std::istream::operator>>
                  ((istream *)is,
                   (m->super_BaseFab<int>).dptr +
                   (long)(iVar4 - iVar1) +
                   (long)(((iVar9 - iVar3) * iVar8 + (iVar5 - iVar2)) * iVar7) +
                   iVar7 * lVar10 *
                   (long)(((m->super_BaseFab<int>).domain.bigend.vect[2] - iVar3) + 1) * (long)iVar8
                  );
        lVar10 = lVar10 + 1;
      } while (lVar10 < local_64);
    }
    std::istream::ignore((long)is,100000);
    if (iVar4 < local_4c.bigend.vect[0]) {
      iVar4 = iVar4 + 1;
    }
    else {
      iVar4 = local_4c.smallend.vect[0];
      if (iVar5 < local_4c.bigend.vect[1]) {
        iVar5 = iVar5 + 1;
      }
      else {
        iVar9 = iVar9 + 1;
        iVar5 = local_4c.smallend.vect[1];
      }
    }
  }
  std::istream::ignore((long)is,100000);
  return is;
}

Assistant:

std::istream&
operator>> (std::istream& is,
            Mask&         m)
{
    is.ignore(BL_IGNORE_MAX,':');
    Box b;
    int ncomp;
    is >> b >> ncomp;
    is.ignore(BL_IGNORE_MAX, '\n');
    m.resize(b,ncomp);
    IntVect sm = b.smallEnd();
    IntVect bg = b.bigEnd();
    IntVect q;
    for (IntVect p = sm; p <= bg; b.next(p))
    {
        is >> q;
        BL_ASSERT( p == q);
        for( int k=0; k<ncomp; k++ ) is >> m(p,k);
        is.ignore(BL_IGNORE_MAX, '\n');
    }
    is.ignore(BL_IGNORE_MAX,'\n');
    BL_ASSERT(is.good());
    return is;
}